

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingResponder.hpp
# Opt level: O2

void __thiscall
ableton::link::
PingResponder<ableton::platforms::asio::AsioService&,ableton::platforms::linux::Clock<1>,ableton::discovery::Socket<512ul>,ableton::util::NullLog>
::Impl::reply<unsigned_char_const*>(Impl *this,uchar *begin,uchar *end,endpoint *to)

{
  _Type auVar1;
  microseconds hostTime;
  uchar *__dest;
  int in_R8D;
  size_t __n;
  MessageBuffer pongBuffer;
  Payload<ableton::link::SessionMembership,_ableton::discovery::Payload<ableton::link::GHostTime,_ableton::discovery::Payload<>_>_>
  local_260;
  uchar local_230 [512];
  
  auVar1 = *(_Type *)(this + 0x10);
  hostTime = ableton::platforms::linux::Clock<1>::micros((Clock<1> *)(this + 0x28));
  local_260.mRest.mFirst.value.time = GhostXForm::hostToGhost((GhostXForm *)(this + 0x18),hostTime);
  local_260.mFirst.header.key = 0x73657373;
  local_260.mFirst.header.size = 8;
  local_260.mRest.mFirst.header.key = 0x5f5f6774;
  local_260.mRest.mFirst.header.size = 8;
  local_260.mFirst.value.sessionId.super_NodeIdArray._M_elems = (SessionId)(SessionId)auVar1;
  __dest = v1::
           pongMessage<ableton::discovery::Payload<ableton::link::SessionMembership,ableton::discovery::Payload<ableton::link::GHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                     (&local_260,local_230);
  __n = (long)end - (long)begin;
  if (__n != 0) {
    memmove(__dest,begin,__n);
  }
  discovery::Socket<512UL>::send
            ((Socket<512UL> *)(this + 0x30),(int)local_230,__dest + (__n - (long)local_230),
             (size_t)to,in_R8D);
  return;
}

Assistant:

void reply(It begin, It end, const asio::ip::udp::endpoint& to)
    {
      using namespace discovery;

      // Encode Pong Message
      const auto id = SessionMembership{mSessionId};
      const auto currentGt = GHostTime{mGhostXForm.hostToGhost(mClock.micros())};
      const auto pongPayload = makePayload(id, currentGt);

      v1::MessageBuffer pongBuffer;
      const auto pongMsgBegin = std::begin(pongBuffer);
      auto pongMsgEnd = v1::pongMessage(pongPayload, pongMsgBegin);
      // Append ping payload to pong message.
      pongMsgEnd = std::copy(begin, end, pongMsgEnd);

      const auto numBytes =
        static_cast<std::size_t>(std::distance(pongMsgBegin, pongMsgEnd));
      mSocket.send(pongBuffer.data(), numBytes, to);
    }